

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo_parallel.cpp
# Opt level: O2

int64_t primecount::pi_lmo_parallel(int64_t x,int threads,bool is_print)

{
  long *plVar1;
  int iVar2;
  uint uVar3;
  uint64_t uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 sum_approx [16];
  undefined1 res [16];
  byte bVar8;
  uint *puVar9;
  uchar *puVar10;
  uint *puVar11;
  int64_t iVar12;
  int64_t segment_size;
  int *piVar13;
  int *piVar14;
  bool bVar15;
  uint uVar16;
  ulong uVar17;
  int64_t iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint64_t uVar22;
  uint64_t low;
  uint64_t uVar23;
  long lVar24;
  uint64_t uVar25;
  ulong uVar26;
  ulong uVar27;
  maxint_t *pmVar28;
  ulong uVar29;
  long lVar30;
  uint64_t uVar31;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  ulong uVar32;
  int64_t m;
  uint64_t uVar33;
  uint64_t i;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  undefined1 in_R9B;
  long lVar37;
  uint64_t uVar38;
  uint64_t uVar39;
  double dVar40;
  double dVar41;
  string_view_t str;
  string_view_t str_00;
  string_view_t str_01;
  string_view_t str_02;
  string_view_t str_03;
  string_view_t str_04;
  string_view_t str_05;
  undefined8 in_stack_fffffffffffff8b8;
  long in_stack_fffffffffffff8c0;
  uint64_t local_720;
  type primes;
  Sieve local_658;
  double local_5c8;
  long local_5c0;
  double local_5b8;
  ulong local_5b0;
  uint64_t local_5a8;
  uint64_t local_5a0;
  ulong local_598;
  Vector<long,_std::allocator<long>_> phi;
  ThreadData local_578;
  Vector<int,_std::allocator<int>_> mu;
  Vector<int,_std::allocator<int>_> lpf;
  PiTable pi;
  LoadBalancerS2 loadBalancer;
  char *extraout_RDX;
  
  if (x < 2) {
    lVar30 = 0;
  }
  else {
    uVar21 = (ulong)(uint)threads;
    x_01._8_8_ = in_stack_fffffffffffff8c0;
    x_01._0_8_ = in_stack_fffffffffffff8b8;
    dVar40 = get_alpha_lmo((primecount *)x,(maxint_t)x_01);
    dVar41 = cbrt((double)x);
    uVar34 = (ulong)dVar41;
    uVar29 = (long)uVar34 >> 0x3f & uVar34;
    for (; (uVar17 = uVar29, 0 < (long)uVar34 &&
           (uVar17 = uVar34,
           uVar34 * uVar34 - (ulong)x / uVar34 != 0 &&
           (long)((ulong)x / uVar34) <= (long)(uVar34 * uVar34))); uVar34 = uVar34 - 1) {
    }
    lVar30 = uVar17 - 1;
    do {
      lVar37 = lVar30 + 2;
      lVar30 = lVar30 + 1;
    } while (lVar37 * lVar37 - x / lVar37 == 0 || lVar37 * lVar37 < x / lVar37);
    uVar29 = (ulong)(dVar40 * (double)lVar30);
    lVar30 = x / (long)uVar29;
    str._M_str = (char *)(x % (long)uVar29);
    if (uVar29 < 0x14) {
      uVar34 = (ulong)(byte)PhiTiny::pi[uVar29];
    }
    else {
      uVar34 = 8;
    }
    if (is_print) {
      str._M_len = (size_t)"";
      print((primecount *)0x0,str);
      str_00._M_str = extraout_RDX;
      str_00._M_len = (size_t)"=== pi_lmo_parallel(x) ===";
      print((primecount *)0x1a,str_00);
      str_01._M_str = extraout_RDX_00;
      str_01._M_len = (size_t)"pi(x) = S1 + S2 + pi(y) - 1 - P2";
      print((primecount *)0x20,str_01);
      x_02._8_8_ = in_stack_fffffffffffff8c0;
      x_02._0_8_ = in_stack_fffffffffffff8b8;
      uVar17 = uVar21;
      print((primecount *)x,(maxint_t)x_02,0,uVar29,lVar30,(int)uVar34);
      in_R9B = (undefined1)uVar17;
    }
    generate_primes_u32(&primes,uVar29);
    generate_lpf(&lpf,uVar29);
    generate_moebius(&mu,uVar29);
    local_5c0 = ((long)primes.end_ - (long)primes.array_ >> 2) + -1;
    uVar17 = P2((primecount *)x,uVar29,local_5c0,uVar21,(uint)is_print,(bool)in_R9B);
    iVar18 = S1(x,uVar29,uVar34,threads,is_print);
    Li(x);
    if (is_print) {
      str_02._M_str = extraout_RDX_01;
      str_02._M_len = (size_t)"";
      print((primecount *)0x0,str_02);
      str_03._M_str = extraout_RDX_02;
      str_03._M_len = (size_t)"=== S2(x, y) ===";
      print((primecount *)0x10,str_03);
      str_04._M_str = extraout_RDX_03;
      str_04._M_len = (size_t)"Algorithm: POPCNT64 bit counting";
      print((primecount *)0x20,str_04);
      local_5c8 = get_time();
    }
    dVar40 = pow((double)lVar30,0.27027027027027023);
    if ((int)dVar40 < threads) {
      uVar21 = (ulong)(uint)(int)dVar40;
    }
    uVar19 = (lVar30 + 0xfffff) / 0x100000;
    uVar20 = uVar19 & 0xffffffff;
    if (uVar21 <= uVar19) {
      uVar20 = uVar21;
    }
    if ((int)uVar21 < 1) {
      uVar20 = 1;
    }
    if (lVar30 + 0xfffff < 0x100000) {
      uVar20 = 1;
    }
    x_00[8] = is_print;
    x_00._0_8_ = uVar20;
    x_00._9_7_ = 0;
    sum_approx._8_8_ = in_stack_fffffffffffff8c0;
    sum_approx._0_8_ = in_stack_fffffffffffff8b8;
    LoadBalancerS2::LoadBalancerS2
              (&loadBalancer,(maxint_t)x_00,x,(maxint_t)sum_approx,0,SUB81(lVar30,0));
    PiTable::PiTable(&pi,uVar29,(int)uVar20);
    local_578.low = 0;
    local_578.segments = 0;
    local_578.segment_size = 0;
    local_578.sum._0_8_ = 0;
    local_578.sum._8_8_ = 0;
    local_578.init_secs = 0.0;
    local_578.secs = 0.0;
    dVar40 = (double)(long)uVar29;
    local_5a8 = lVar30 + 1;
    local_5b0 = uVar29 - 1;
    local_5b8 = SQRT(dVar40);
    while (bVar15 = LoadBalancerS2::get_work(&loadBalancer,&local_578), bVar15) {
      local_578.secs = get_time();
      segment_size = local_578.segment_size;
      iVar12 = local_578.segments;
      low = local_578.low;
      uVar21 = 1;
      if (1 < local_578.low) {
        uVar21 = local_578.low;
      }
      dVar41 = local_5b8;
      if (dVar40 < 0.0) {
        dVar41 = sqrt(dVar40);
      }
      uVar20 = (ulong)dVar41;
      if (0xb504f332 < (long)uVar20) {
        uVar20 = 0xb504f333;
      }
      if ((long)uVar29 < (long)(uVar20 * uVar20)) {
        do {
          uVar20 = uVar20 - 1;
        } while (uVar20 * uVar20 - uVar29 != 0 && (long)uVar29 <= (long)(uVar20 * uVar20));
      }
      else {
        lVar37 = uVar20 * 2;
        if (lVar37 < (long)(uVar29 - uVar20 * uVar20)) {
          do {
            uVar20 = uVar20 + 1;
            lVar37 = lVar37 + 2;
          } while (lVar37 < (long)(uVar29 - uVar20 * uVar20));
        }
      }
      if (uVar20 < 6) {
        local_720 = *(uint64_t *)(BitSieve240::pi_tiny_ + uVar20 * 8);
      }
      else {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar20;
        uVar33 = pi.pi_.array_[uVar20 / 0xf0].count;
        uVar20 = *(ulong *)(BitSieve240::unset_larger_ + (ulong)SUB164(auVar5 % ZEXT816(0xf0),0) * 8
                           ) & pi.pi_.array_[uVar20 / 0xf0].bits;
        if ((anonymous_namespace)::cpu_supports_popcnt == 1) {
          local_720 = POPCOUNT(uVar20);
        }
        else {
          local_720 = anon_unknown.dwarf_89117::popcnt64_bitwise_noinline(uVar20);
        }
        local_720 = local_720 + uVar33;
      }
      uVar33 = iVar12 * segment_size + low;
      if ((long)local_5a8 < (long)uVar33) {
        uVar33 = local_5a8;
      }
      uVar21 = (ulong)x / uVar21;
      dVar41 = (double)(long)uVar21;
      if (dVar41 < 0.0) {
        dVar41 = sqrt(dVar41);
      }
      else {
        dVar41 = SQRT(dVar41);
      }
      uVar20 = (ulong)dVar41;
      if (0xb504f332 < (long)uVar20) {
        uVar20 = 0xb504f333;
      }
      if ((long)uVar21 < (long)(uVar20 * uVar20)) {
        do {
          uVar20 = uVar20 - 1;
        } while (uVar20 * uVar20 - uVar21 != 0 && (long)uVar21 <= (long)(uVar20 * uVar20));
      }
      else {
        lVar37 = uVar20 * 2;
        if (lVar37 < (long)(uVar21 - uVar20 * uVar20)) {
          do {
            uVar20 = uVar20 + 1;
            lVar37 = lVar37 + 2;
          } while (lVar37 < (long)(uVar21 - uVar20 * uVar20));
        }
      }
      if ((long)local_5b0 < (long)uVar20) {
        uVar20 = local_5b0;
      }
      if (uVar20 < 6) {
        uVar22 = *(uint64_t *)(BitSieve240::pi_tiny_ + uVar20 * 8);
      }
      else {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar20;
        uVar39 = pi.pi_.array_[uVar20 / 0xf0].count;
        uVar21 = *(ulong *)(BitSieve240::unset_larger_ + (ulong)SUB164(auVar6 % ZEXT816(0xf0),0) * 8
                           ) & pi.pi_.array_[uVar20 / 0xf0].bits;
        if ((anonymous_namespace)::cpu_supports_popcnt == 1) {
          uVar22 = POPCOUNT(uVar21);
        }
        else {
          uVar22 = anon_unknown.dwarf_89117::popcnt64_bitwise_noinline(uVar21);
        }
        uVar22 = uVar22 + uVar39;
      }
      uVar21 = (ulong)primes.array_[uVar22];
      if (lVar30 / (long)uVar33 < (long)(ulong)primes.array_[uVar22]) {
        uVar21 = lVar30 / (long)uVar33;
      }
      if ((uVar21 & 0xffffffff) < 6) {
        local_598 = *(ulong *)(BitSieve240::pi_tiny_ + (uVar21 & 0xffffffff) * 8);
      }
      else {
        uVar20 = (uVar21 & 0xffffffff) / 0xf0;
        uVar39 = pi.pi_.array_[uVar20].count;
        uVar21 = *(ulong *)(BitSieve240::unset_larger_ + ((uVar21 & 0xffffffff) % 0xf0) * 8) &
                 pi.pi_.array_[uVar20].bits;
        if ((anonymous_namespace)::cpu_supports_popcnt == 1) {
          uVar31 = POPCOUNT(uVar21);
        }
        else {
          uVar31 = anon_unknown.dwarf_89117::popcnt64_bitwise_noinline(uVar21);
        }
        local_598 = uVar31 + uVar39;
      }
      if ((long)local_598 <= (long)uVar34) {
        local_598 = uVar34;
      }
      if ((long)local_598 < (long)uVar22) {
        phi_vector(&phi,low,uVar22,&primes,&pi);
        Sieve::Sieve(&local_658,low,segment_size,uVar22);
        local_578.init_secs = get_time();
        local_578.init_secs = local_578.init_secs - local_578.secs;
        if ((long)uVar22 < (long)local_720) {
          local_720 = uVar22;
        }
        lVar37 = 0;
LAB_0011771f:
        uVar39 = low;
        uVar21 = local_598;
        if ((long)uVar39 < (long)uVar33) {
          low = segment_size + uVar39;
          uVar31 = low;
          if ((long)uVar33 < (long)low) {
            uVar31 = uVar33;
          }
          uVar23 = 1;
          if (1 < (long)uVar39) {
            uVar23 = uVar39;
          }
          Sieve::pre_sieve<unsigned_int>(&local_658,&primes,local_598,uVar39,uVar31);
          while (piVar14 = lpf.array_, piVar13 = mu.array_, plVar1 = phi.array_,
                puVar9 = local_658.counter_.counter.array_, uVar4 = local_658.counter_.dist,
                puVar10 = local_658.sieve_.array_,
                bVar8 = (anonymous_namespace)::cpu_supports_popcnt, i = uVar21 + 1,
                (long)uVar21 < (long)local_720) {
            uVar21 = (ulong)primes.array_[i];
            lVar24 = x / (long)(uVar31 * uVar21);
            lVar35 = (long)uVar29 / (long)uVar21;
            if ((long)uVar29 / (long)uVar21 < lVar24) {
              lVar35 = lVar24;
            }
            uVar20 = (ulong)x / (uVar23 * uVar21);
            if ((long)uVar29 <= (long)uVar20) {
              uVar20 = uVar29;
            }
            if ((long)uVar20 <= (long)uVar21) goto LAB_0011771f;
            for (; lVar35 < (long)uVar20; uVar20 = uVar20 - 1) {
              iVar2 = piVar13[uVar20];
              if (((long)iVar2 != 0) && ((long)uVar21 < (long)piVar14[uVar20])) {
                uVar19 = x / (long)(uVar20 * uVar21) - uVar39;
                uVar25 = local_658.prev_stop_ + 1;
                local_658.prev_stop_ = uVar19;
                if (uVar25 <= uVar19) {
                  for (; local_658.counter_.stop <= uVar19;
                      local_658.counter_.stop = local_658.counter_.stop + uVar4) {
                    local_658.count_ = local_658.counter_.sum + puVar9[local_658.counter_.i];
                    uVar25 = local_658.counter_.stop;
                    local_658.counter_.sum = local_658.count_;
                    local_658.counter_.i = local_658.counter_.i + 1;
                  }
                  uVar26 = uVar25 / 0xf0;
                  uVar27 = uVar19 / 0xf0;
                  uVar32 = *(ulong *)(Sieve::unset_larger + (uVar19 % 0xf0) * 8);
                  uVar36 = 0xffffffffffffffff;
                  if (uVar26 == uVar27) {
                    uVar32 = 0;
                    uVar36 = *(ulong *)(Sieve::unset_larger + (uVar19 % 0xf0) * 8);
                  }
                  uVar19 = uVar36 & *(ulong *)(Sieve::unset_smaller + (uVar25 % 0xf0) * 8) &
                           *(ulong *)(puVar10 + uVar26 * 8);
                  if ((bVar8 & 1) == 0) {
                    local_5a0 = uVar32 & *(ulong *)(puVar10 + uVar27 * 8);
                    uVar38 = anon_unknown.dwarf_89117::popcnt64_bitwise_noinline(uVar19);
                    uVar25 = anon_unknown.dwarf_89117::popcnt64_bitwise_noinline(local_5a0);
                    in_stack_fffffffffffff8c0 = lVar37;
                  }
                  else {
                    uVar38 = POPCOUNT(uVar19);
                    uVar25 = POPCOUNT(uVar32 & *(ulong *)(puVar10 + uVar27 * 8));
                  }
                  lVar24 = uVar38 + uVar25;
                  while (uVar26 = uVar26 + 1, uVar26 < uVar27) {
                    if ((bVar8 & 1) == 0) {
                      uVar25 = anon_unknown.dwarf_89117::popcnt64_bitwise_noinline
                                         (*(uint64_t *)(puVar10 + uVar26 * 8));
                      in_stack_fffffffffffff8c0 = lVar37;
                    }
                    else {
                      uVar25 = POPCOUNT(*(uint64_t *)(puVar10 + uVar26 * 8));
                    }
                    lVar24 = lVar24 + uVar25;
                  }
                  local_658.count_ = lVar24 + local_658.count_;
                }
                lVar37 = lVar37 - (local_658.count_ + plVar1[i]) * (long)iVar2;
              }
            }
            plVar1 = plVar1 + i;
            *plVar1 = *plVar1 + local_658.total_count_;
            Sieve::cross_off_count(&local_658,uVar21,i);
            uVar21 = i;
          }
          for (; puVar9 = primes.array_, (long)i <= (long)uVar22; i = i + 1) {
            uVar3 = primes.array_[i];
            uVar20 = (ulong)uVar3;
            uVar21 = (ulong)x / (uVar23 * uVar20);
            if ((long)uVar29 <= (long)uVar21) {
              uVar21 = uVar29;
            }
            if (uVar21 < 6) {
              lVar35 = *(long *)(BitSieve240::pi_tiny_ + uVar21 * 8);
            }
            else {
              auVar7._8_8_ = 0;
              auVar7._0_8_ = uVar21;
              uVar4 = pi.pi_.array_[uVar21 / 0xf0].count;
              uVar21 = *(ulong *)(BitSieve240::unset_larger_ +
                                 (ulong)SUB164(auVar7 % ZEXT816(0xf0),0) * 8) &
                       pi.pi_.array_[uVar21 / 0xf0].bits;
              if ((anonymous_namespace)::cpu_supports_popcnt == 1) {
                uVar25 = POPCOUNT(uVar21);
              }
              else {
                uVar25 = anon_unknown.dwarf_89117::popcnt64_bitwise_noinline(uVar21);
                in_stack_fffffffffffff8c0 = lVar37;
              }
              lVar35 = uVar25 + uVar4;
            }
            plVar1 = phi.array_;
            puVar11 = local_658.counter_.counter.array_;
            uVar4 = local_658.counter_.dist;
            puVar10 = local_658.sieve_.array_;
            bVar8 = (anonymous_namespace)::cpu_supports_popcnt;
            uVar21 = x / (long)(uVar31 * uVar20);
            if ((long)uVar21 <= (long)uVar20) {
              uVar21 = uVar20;
            }
            uVar16 = puVar9[lVar35];
            if (uVar16 <= uVar3) break;
            while (uVar21 < uVar16) {
              uVar19 = (ulong)x / (uVar16 * uVar20) - uVar39;
              uVar25 = local_658.prev_stop_ + 1;
              local_658.prev_stop_ = uVar19;
              if (uVar25 <= uVar19) {
                for (; local_658.counter_.stop <= uVar19;
                    local_658.counter_.stop = local_658.counter_.stop + uVar4) {
                  local_658.count_ = local_658.counter_.sum + puVar11[local_658.counter_.i];
                  uVar25 = local_658.counter_.stop;
                  local_658.counter_.sum = local_658.count_;
                  local_658.counter_.i = local_658.counter_.i + 1;
                }
                uVar26 = uVar25 / 0xf0;
                uVar27 = uVar19 / 0xf0;
                uVar32 = *(ulong *)(Sieve::unset_larger + (uVar19 % 0xf0) * 8);
                uVar36 = 0xffffffffffffffff;
                if (uVar26 == uVar27) {
                  uVar32 = 0;
                  uVar36 = *(ulong *)(Sieve::unset_larger + (uVar19 % 0xf0) * 8);
                }
                uVar36 = uVar36 & *(ulong *)(Sieve::unset_smaller + (uVar25 % 0xf0) * 8) &
                         *(ulong *)(puVar10 + uVar26 * 8);
                uVar19 = *(ulong *)(puVar10 + uVar27 * 8);
                if ((bVar8 & 1) == 0) {
                  uVar38 = anon_unknown.dwarf_89117::popcnt64_bitwise_noinline(uVar36);
                  uVar25 = anon_unknown.dwarf_89117::popcnt64_bitwise_noinline(uVar32 & uVar19);
                  in_stack_fffffffffffff8c0 = lVar37;
                }
                else {
                  uVar38 = POPCOUNT(uVar36);
                  uVar25 = POPCOUNT(uVar32 & uVar19);
                }
                lVar24 = uVar38 + uVar25;
                while (uVar26 = uVar26 + 1, uVar26 < uVar27) {
                  if ((bVar8 & 1) == 0) {
                    uVar25 = anon_unknown.dwarf_89117::popcnt64_bitwise_noinline
                                       (*(uint64_t *)(puVar10 + uVar26 * 8));
                    in_stack_fffffffffffff8c0 = lVar37;
                  }
                  else {
                    uVar25 = POPCOUNT(*(uint64_t *)(puVar10 + uVar26 * 8));
                  }
                  lVar24 = lVar24 + uVar25;
                }
                local_658.count_ = lVar24 + local_658.count_;
              }
              lVar37 = local_658.count_ + lVar37 + plVar1[i];
              lVar24 = lVar35 + -1;
              lVar35 = lVar35 + -1;
              uVar16 = puVar9[lVar24];
            }
            plVar1 = plVar1 + i;
            *plVar1 = *plVar1 + local_658.total_count_;
            Sieve::cross_off_count(&local_658,uVar20,i);
          }
          goto LAB_0011771f;
        }
        Sieve::~Sieve(&local_658);
        Vector<long,_std::allocator<long>_>::~Vector(&phi);
      }
      else {
        lVar37 = 0;
      }
      local_578.sum._8_8_ = lVar37 >> 0x3f;
      local_578.sum._0_8_ = lVar37;
      dVar41 = get_time();
      local_578.secs = dVar41 - local_578.secs;
    }
    pmVar28 = LoadBalancerS2::get_sum(&loadBalancer);
    if (is_print) {
      res._8_8_ = in_stack_fffffffffffff8c0;
      res._0_8_ = in_stack_fffffffffffff8b8;
      str_05._M_str = "S2";
      str_05._M_len = 2;
      print(str_05,(maxint_t)res,local_5c8);
    }
    PiTable::~PiTable(&pi);
    lVar30 = local_5c0 + ~uVar17 + iVar18 + (long)pmVar28;
    Vector<int,_std::allocator<int>_>::~Vector(&mu);
    Vector<int,_std::allocator<int>_>::~Vector(&lpf);
    Vector<unsigned_int,_std::allocator<unsigned_int>_>::~Vector(&primes);
  }
  return lVar30;
}

Assistant:

int64_t pi_lmo_parallel(int64_t x,
                        int threads,
                        bool is_print)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t z = x / y;
  int64_t c = PhiTiny::get_c(y);

  if (is_print)
  {
    print("");
    print("=== pi_lmo_parallel(x) ===");
    print("pi(x) = S1 + S2 + pi(y) - 1 - P2");
    print(x, y, z, c, threads);
  }

  auto primes = generate_primes<uint32_t>(y);
  auto lpf = generate_lpf(y);
  auto mu = generate_moebius(y);

  int64_t pi_y = primes.size() - 1;
  int64_t p2 = P2(x, y, pi_y, threads, is_print);
  int64_t s1 = S1(x, y, c, threads, is_print);
  int64_t s2_approx = S2_approx(x, pi_y, p2, s1);
  int64_t s2 = S2(x, y, z, c, s2_approx, primes, lpf, mu, threads, is_print);
  int64_t phi = s1 + s2;
  int64_t sum = phi + pi_y - 1 - p2;

  return sum;
}